

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_simplifier.cc
# Opt level: O2

bool __thiscall S2PolylineSimplifier::Extend(S2PolylineSimplifier *this,S2Point *dst)

{
  bool bVar1;
  S1ChordAngle SVar2;
  double p;
  S1ChordAngle local_20;
  
  S1ChordAngle::S1ChordAngle(&local_20,&this->src_,dst);
  SVar2 = S1ChordAngle::Right();
  if (local_20.length2_ <= SVar2.length2_) {
    p = GetAngle(this,dst);
    bVar1 = S1Interval::Contains(&this->window_,p);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool S2PolylineSimplifier::Extend(const S2Point& dst) const {
  // We limit the maximum edge length to 90 degrees in order to simplify the
  // error bounds.  (The error gets arbitrarily large as the edge length
  // approaches 180 degrees.)
  if (S1ChordAngle(src_, dst) > S1ChordAngle::Right()) return false;

  // Otherwise check whether this vertex is in the acceptable angle range.
  return window_.Contains(GetAngle(dst));
}